

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint checkColorValidity(LodePNGColorType colortype,uint bd)

{
  uint uVar1;
  
  uVar1 = 0x1f;
  switch(colortype) {
  case LCT_GREY:
    uVar1 = 0x25;
    if ((bd < 0x11) && ((0x10116U >> (bd & 0x1f) & 1) != 0)) {
      return 0;
    }
    break;
  case LCT_RGB:
  case LCT_GREY_ALPHA:
  case LCT_RGBA:
    uVar1 = 0x25;
    if ((bd - 8 & 0xfffffff7) == 0) {
      uVar1 = 0;
    }
    return uVar1;
  case LCT_PALETTE:
    uVar1 = 0x25;
    if (bd - 1 < 8) {
      uVar1 = *(uint *)(&DAT_00124178 + (ulong)(bd - 1) * 4);
    }
  }
  return uVar1;
}

Assistant:

static unsigned checkColorValidity(LodePNGColorType colortype, unsigned bd) /*bd = bitdepth*/
{
	switch (colortype)
	{
	case 0: if (!(bd == 1 || bd == 2 || bd == 4 || bd == 8 || bd == 16)) return 37; break; /*grey*/
	case 2: if (!(bd == 8 || bd == 16)) return 37; break; /*RGB*/
	case 3: if (!(bd == 1 || bd == 2 || bd == 4 || bd == 8)) return 37; break; /*palette*/
	case 4: if (!(bd == 8 || bd == 16)) return 37; break; /*grey + alpha*/
	case 6: if (!(bd == 8 || bd == 16)) return 37; break; /*RGBA*/
	default: return 31;
	}
	return 0; /*allowed color type / bits combination*/
}